

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

void __thiscall hta::Metric::insert(Metric *this,Row row)

{
  Aggregate a;
  Aggregate aggregate;
  Aggregate a_00;
  TimeAggregate ta;
  TimeAggregate ta_00;
  Row row_00;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> t;
  Level *pLVar1;
  bool bVar2;
  pointer pMVar3;
  undefined8 local_2a0 [6];
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_270;
  TimeAggregate local_268;
  duration local_230;
  Level local_228;
  undefined8 local_1f0 [6];
  duration local_1c0;
  Duration local_1b8;
  Row local_1b0;
  base local_170;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  level_time_begin;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  TimeAggregate local_130;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_f8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_f0;
  rep local_e8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_e0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_d8;
  TimePoint level_time_end;
  undefined1 local_b8 [64];
  rep local_78;
  Level *local_70;
  Level *level;
  int64_t local_28;
  rep local_20;
  Duration local_18;
  Duration interval;
  Metric *this_local;
  
  local_20 = row.interval.__r;
  local_28 = (this->interval_factor_).factor_;
  interval.__r = (rep)this;
  local_18 = hta::operator*(row.interval,(IntervalFactor)local_28);
  bVar2 = std::chrono::operator>(&local_18,&this->interval_max_);
  if (bVar2) {
    pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
             operator->(&this->storage_metric_);
    memcpy(&level,&row,0x40);
    (*pMVar3->_vptr_Metric[3])();
  }
  else {
    local_78 = local_18.__r;
    local_70 = get_level(this,local_18);
    pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
             operator->(&this->storage_metric_);
    memcpy(local_b8,&row,0x40);
    (*pMVar3->_vptr_Metric[3])();
    bVar2 = Clock::time_point::operator_cast_to_bool(&local_70->time_current);
    if (bVar2) {
      bVar2 = std::chrono::operator!=
                        ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)local_70,
                         &row.time.
                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        );
      if (bVar2) {
        level_time_end =
             (TimePoint)
             row.time.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
                  ("inconsistent level time for interval ",
                   (duration<long,_std::ratio<1L,_1000000000L>_>)local_18.__r," time_current: ",
                   (time_point)
                   (local_70->time_current).
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r," row.time: ",
                   (time_point)
                   row.time.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r);
      }
    }
    else {
      (local_70->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (rep)row.time.
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r;
    }
    local_e0.__d.__r =
         (duration)
         (local_70->time_current).
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_e8 = local_18.__r;
    local_d8.__d.__r = (duration)interval_end((TimePoint)local_e0.__d.__r,local_18);
    local_f0.__d.__r = (duration)Row::end_time(&row);
    bVar2 = std::chrono::operator>=(&local_f0,&local_d8);
    pLVar1 = local_70;
    if (bVar2) {
      local_f8.__d.__r = (duration)Row::end_time(&row);
      bVar2 = std::chrono::operator==(&local_f8,&local_d8);
      pLVar1 = local_70;
      t.__d.__r = local_d8.__d.__r;
      if (!bVar2) {
        __assert_fail("row.end_time() == level_time_end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                      ,0x24c,"void hta::Metric::insert(Row)");
      }
      memcpy(&level_time_begin,&row.aggregate,0x30);
      a.maximum._0_4_ = (int)uStack_160;
      a.minimum = (Value)level_time_begin.__d.__r;
      a.maximum._4_4_ = (int)((ulong)uStack_160 >> 0x20);
      a.sum._0_4_ = (int)local_158;
      a.sum._4_4_ = (int)((ulong)local_158 >> 0x20);
      a.count._0_4_ = (int)uStack_150;
      a.count._4_4_ = (int)((ulong)uStack_150 >> 0x20);
      a.integral._0_4_ = (int)local_148;
      a.integral._4_4_ = (int)((ulong)local_148 >> 0x20);
      a.active_time.__r._0_4_ = (int)uStack_140;
      a.active_time.__r._4_4_ = (int)((ulong)uStack_140 >> 0x20);
      TimeAggregate::TimeAggregate(&local_130,(TimePoint)t.__d.__r,a);
      ta.aggregate.minimum._0_4_ = SUB84(local_130.aggregate.minimum,0);
      ta.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = local_130.time.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
      ta.aggregate.minimum._4_4_ = (int)((ulong)local_130.aggregate.minimum >> 0x20);
      ta.aggregate.maximum._0_4_ = SUB84(local_130.aggregate.maximum,0);
      ta.aggregate.maximum._4_4_ = (int)((ulong)local_130.aggregate.maximum >> 0x20);
      ta.aggregate.sum._0_4_ = SUB84(local_130.aggregate.sum,0);
      ta.aggregate.sum._4_4_ = (int)((ulong)local_130.aggregate.sum >> 0x20);
      ta.aggregate.count._0_4_ = (int)local_130.aggregate.count;
      ta.aggregate.count._4_4_ = (int)(local_130.aggregate.count >> 0x20);
      ta.aggregate.integral._0_4_ = SUB84(local_130.aggregate.integral,0);
      ta.aggregate.integral._4_4_ = (int)((ulong)local_130.aggregate.integral >> 0x20);
      ta.aggregate.active_time.__r._0_4_ = (int)local_130.aggregate.active_time.__r;
      ta.aggregate.active_time.__r._4_4_ = (int)((ulong)local_130.aggregate.active_time.__r >> 0x20)
      ;
      Level::advance(pLVar1,ta);
      local_170.__d.__r = (duration)std::chrono::operator-(&local_d8,&local_18);
      local_1b8.__r = local_18.__r;
      Clock::time_point::time_point((time_point *)&local_1c0,&local_170);
      memcpy(local_1f0,&local_70->aggregate,0x30);
      aggregate.maximum._0_4_ = (int)local_1f0[1];
      aggregate.minimum = (Value)local_1f0[0];
      aggregate.maximum._4_4_ = (int)((ulong)local_1f0[1] >> 0x20);
      aggregate.sum._0_4_ = (int)local_1f0[2];
      aggregate.sum._4_4_ = (int)((ulong)local_1f0[2] >> 0x20);
      aggregate.count._0_4_ = (int)local_1f0[3];
      aggregate.count._4_4_ = (int)((ulong)local_1f0[3] >> 0x20);
      aggregate.integral._0_4_ = (int)local_1f0[4];
      aggregate.integral._4_4_ = (int)((ulong)local_1f0[4] >> 0x20);
      aggregate.active_time.__r._0_4_ = (int)local_1f0[5];
      aggregate.active_time.__r._4_4_ = (int)((ulong)local_1f0[5] >> 0x20);
      Row::Row(&local_1b0,local_1b8,(TimePoint)local_1c0.__r,aggregate);
      row_00.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r._0_4_ = (int)local_1b0.time.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r;
      row_00.interval.__r = local_1b0.interval.__r;
      row_00.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r._4_4_ = local_1b0.time.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r._4_4_;
      row_00.aggregate.minimum._0_4_ = SUB84(local_1b0.aggregate.minimum,0);
      row_00.aggregate.minimum._4_4_ = (int)((ulong)local_1b0.aggregate.minimum >> 0x20);
      row_00.aggregate.maximum._0_4_ = SUB84(local_1b0.aggregate.maximum,0);
      row_00.aggregate.maximum._4_4_ = (int)((ulong)local_1b0.aggregate.maximum >> 0x20);
      row_00.aggregate.sum._0_4_ = SUB84(local_1b0.aggregate.sum,0);
      row_00.aggregate.sum._4_4_ = (int)((ulong)local_1b0.aggregate.sum >> 0x20);
      row_00.aggregate.count._0_4_ = (int)local_1b0.aggregate.count;
      row_00.aggregate.count._4_4_ = (int)(local_1b0.aggregate.count >> 0x20);
      row_00.aggregate.integral._0_4_ = SUB84(local_1b0.aggregate.integral,0);
      row_00.aggregate.integral._4_4_ = (int)((ulong)local_1b0.aggregate.integral >> 0x20);
      row_00.aggregate.active_time.__r._0_4_ = (int)local_1b0.aggregate.active_time.__r;
      row_00.aggregate.active_time.__r._4_4_ =
           (int)((ulong)local_1b0.aggregate.active_time.__r >> 0x20);
      insert(this,row_00);
      local_230 = local_d8.__d.__r;
      Level::Level(&local_228,(TimePoint)local_d8.__d.__r);
      memcpy(local_70,&local_228,0x38);
    }
    else {
      local_270.__d.__r = (duration)Row::end_time(&row);
      memcpy(local_2a0,&row.aggregate,0x30);
      a_00.maximum._0_4_ = (int)local_2a0[1];
      a_00.minimum = (Value)local_2a0[0];
      a_00.maximum._4_4_ = (int)((ulong)local_2a0[1] >> 0x20);
      a_00.sum._0_4_ = (int)local_2a0[2];
      a_00.sum._4_4_ = (int)((ulong)local_2a0[2] >> 0x20);
      a_00.count._0_4_ = (int)local_2a0[3];
      a_00.count._4_4_ = (int)((ulong)local_2a0[3] >> 0x20);
      a_00.integral._0_4_ = (int)local_2a0[4];
      a_00.integral._4_4_ = (int)((ulong)local_2a0[4] >> 0x20);
      a_00.active_time.__r._0_4_ = (int)local_2a0[5];
      a_00.active_time.__r._4_4_ = (int)((ulong)local_2a0[5] >> 0x20);
      TimeAggregate::TimeAggregate(&local_268,(TimePoint)local_270.__d.__r,a_00);
      ta_00.aggregate.minimum._0_4_ = SUB84(local_268.aggregate.minimum,0);
      ta_00.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = local_268.time.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
      ta_00.aggregate.minimum._4_4_ = (int)((ulong)local_268.aggregate.minimum >> 0x20);
      ta_00.aggregate.maximum._0_4_ = SUB84(local_268.aggregate.maximum,0);
      ta_00.aggregate.maximum._4_4_ = (int)((ulong)local_268.aggregate.maximum >> 0x20);
      ta_00.aggregate.sum._0_4_ = SUB84(local_268.aggregate.sum,0);
      ta_00.aggregate.sum._4_4_ = (int)((ulong)local_268.aggregate.sum >> 0x20);
      ta_00.aggregate.count._0_4_ = (int)local_268.aggregate.count;
      ta_00.aggregate.count._4_4_ = (int)(local_268.aggregate.count >> 0x20);
      ta_00.aggregate.integral._0_4_ = SUB84(local_268.aggregate.integral,0);
      ta_00.aggregate.integral._4_4_ = (int)((ulong)local_268.aggregate.integral >> 0x20);
      ta_00.aggregate.active_time.__r._0_4_ = (int)local_268.aggregate.active_time.__r;
      ta_00.aggregate.active_time.__r._4_4_ =
           (int)((ulong)local_268.aggregate.active_time.__r >> 0x20);
      Level::advance(pLVar1,ta_00);
    }
  }
  return;
}

Assistant:

void Metric::insert(Row row)
{
    const auto interval = row.interval * interval_factor_;
    if (interval > interval_max_)
    {
        // write this but don't do anything else!
        storage_metric_->insert(row);
        return;
    }
    auto& level = get_level(interval);
    // We must do this after get_level, otherwise it confuses the level restore
    storage_metric_->insert(row);
    if (!level.time_current)
    {
        level.time_current = row.time;
    }
    else if (level.time_current != row.time)
    {
        throw_exception("inconsistent level time for interval ", interval,
                        " time_current: ", level.time_current, " row.time: ", row.time);
    }
    auto level_time_end = interval_end(level.time_current, interval);
    if (row.end_time() >= level_time_end)
    {
        // the new row from below completes the interval at current level
        // Small intervals should never cross through multiple larger ones
        assert(row.end_time() == level_time_end);
        // Close the interval and make a new one
        level.advance({ level_time_end, row.aggregate });

        auto level_time_begin = level_time_end - interval;

        // Inform higher levels of this new closed level
        insert({ interval, level_time_begin, level.aggregate });

        // reset the interval at current level
        level = Level(level_time_end);
        return;
    }

    level.advance({ row.end_time(), row.aggregate });
}